

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

db_bit * __thiscall lan::db::read_container_bit(db *this,string *content,bool in_array)

{
  int iVar1;
  db_bit *__rhs;
  db_bit *pdVar2;
  logic_error *this_00;
  long *plVar3;
  size_type *psVar4;
  undefined7 in_register_00000011;
  db *pdVar5;
  db *this_01;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pdVar5 = (db *)&local_68;
  this_01 = (db *)content;
  __rhs = (db_bit *)operator_new(0x50);
  (__rhs->key)._M_dataplus._M_p = (pointer)&(__rhs->key).field_2;
  (__rhs->key)._M_string_length = 0;
  (__rhs->key).field_2._M_local_buf[0] = '\0';
  __rhs->data = (void *)0x0;
  __rhs->pre = (db_bit *)0x0;
  __rhs->nex = (db_bit *)0x0;
  __rhs->lin = (db_bit *)0x0;
  __rhs->con = (db_bit *)0x0;
  if ((int)CONCAT71(in_register_00000011,in_array) == 0) {
    pop_next(&local_68,this_01,content);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&local_68);
    this_01 = pdVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      this_01 = (db *)(local_68.field_2._M_allocated_capacity + 1);
      operator_delete(local_68._M_dataplus._M_p,(ulong)this_01);
    }
  }
  __rhs->type = Container;
  pop_next(&local_68,this_01,content);
  iVar1 = std::__cxx11::string::compare((char *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 == 0) {
    pdVar2 = get_container_data(this,content);
    __rhs->lin = pdVar2;
    return __rhs;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"LANDB (pull_error): unable read container <",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_68._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_68._M_dataplus._M_p == psVar4) {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68.field_2._8_8_ = plVar3[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar4;
  }
  local_68._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

lan::db_bit * db::read_container_bit(std::string & content, bool in_array){
            db_bit * bit = new db_bit;
            if(!in_array)
                bit->key = pop_next(content);
            bit->type = Container;
            if(pop_next(content) == ":") {
                bit->lin = get_container_data(content);
            } else {
                throw lan::errors::pull_error ("LANDB (pull_error): unable read container <" + bit->key + ">, the param <:> was not found.");
            } return bit;
        }